

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdDecomposeInt(Dau_Dsd_t *p,word *pTruth,int nVarsInit)

{
  int iVar1;
  char cVar2;
  uint nVars;
  int iVar3;
  ulong uVar4;
  char (*pacVar5) [32];
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int pVars [16];
  
  if (0x10 < (uint)nVarsInit) {
    __assert_fail("nVarsInit >= 0 && nVarsInit <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                  ,0x3dc,"void Dau_DsdInitialize(Dau_Dsd_t *, int)");
  }
  uVar9 = (ulong)(uint)nVarsInit;
  p->nVarsInit = nVarsInit;
  p->nVarsUsed = nVarsInit;
  p->nPos = 0;
  p->nSizeNonDec = 0;
  p->nConsts = 0;
  p->uConstMask = 0;
  for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
    p->pVarDefs[uVar4][0] = (char)uVar4 + 'a';
    p->pVarDefs[uVar4][1] = '\0';
  }
  pacVar5 = p->Cache;
  for (uVar4 = 0; uVar4 != uVar9; uVar4 = uVar4 + 1) {
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      (*pacVar5)[uVar8] = '\0';
    }
    pacVar5 = pacVar5 + 1;
  }
  nVars = Dau_DsdMinBase(pTruth,nVarsInit,pVars);
  if ((0 < (int)nVars) && ((int)nVars <= nVarsInit)) {
    if (nVars == 1) {
      Dau_DsdWriteVar(p,pVars[0],(uint)*pTruth & 1);
      iVar3 = 0;
    }
    else if (nVars < 7) {
      iVar3 = Dau_Dsd6DecomposeInternal(p,pTruth,pVars,nVars);
    }
    else {
      iVar3 = Dau_DsdDecomposeInternal(p,pTruth,pVars,nVars);
    }
    iVar7 = -1;
    for (iVar6 = 0; iVar6 < p->nConsts; iVar6 = iVar6 + 1) {
      cVar2 = ']';
      if (((uint)p->uConstMask >> (p->nConsts + iVar7 & 0x1fU) & 1) == 0) {
        cVar2 = ')';
      }
      iVar1 = p->nPos;
      p->nPos = iVar1 + 1;
      p->pOutput[iVar1] = cVar2;
      iVar7 = iVar7 + -1;
    }
    iVar7 = p->nPos;
    p->nPos = iVar7 + 1;
    p->pOutput[iVar7] = '\0';
    return iVar3;
  }
  __assert_fail("nVars > 0 && nVars <= nVarsInit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                ,0x76e,"int Dau_DsdDecomposeInt(Dau_Dsd_t *, word *, int)");
}

Assistant:

static inline void Dau_DsdInitialize( Dau_Dsd_t * p, int nVarsInit )
{
    int i, v, u;
    assert( nVarsInit >= 0 && nVarsInit <= 16 );
    p->nVarsInit   = nVarsInit;
    p->nVarsUsed   = nVarsInit;
    p->nPos        = 0;
    p->nSizeNonDec = 0;
    p->nConsts     = 0;
    p->uConstMask  = 0;
    for ( i = 0; i < nVarsInit; i++ )
        p->pVarDefs[i][0] = 'a' + i, p->pVarDefs[i][1] = 0;
    for ( v = 0; v < nVarsInit; v++ )
    for ( u = 0; u < nVarsInit; u++ )
        p->Cache[v][u] = 0;

}